

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O0

void __thiscall Memory::HeapInfo::PrepareSweep(HeapInfo *this)

{
  uint local_18;
  uint local_14;
  uint i_1;
  uint i;
  HeapInfo *this_local;
  
  for (local_14 = 0; local_14 < 0x30; local_14 = local_14 + 1) {
    HeapBucketGroup<SmallAllocationBlockAttributes>::PrepareSweep(this->heapBuckets + local_14);
  }
  for (local_18 = 0; local_18 < 0x1d; local_18 = local_18 + 1) {
    HeapBucketGroup<MediumAllocationBlockAttributes>::PrepareSweep
              (this->mediumHeapBuckets + local_18);
  }
  return;
}

Assistant:

void
HeapInfo::PrepareSweep()
{
    for (uint i = 0; i < HeapConstants::BucketCount; i++)
    {
        heapBuckets[i].PrepareSweep();
    }

#if defined(BUCKETIZE_MEDIUM_ALLOCATIONS) && SMALLBLOCK_MEDIUM_ALLOC
    for (uint i = 0; i < HeapConstants::MediumBucketCount; i++)
    {
        mediumHeapBuckets[i].PrepareSweep();
    }
#endif
}